

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_RadiusDamageSelf
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  int iVar1;
  uint uVar2;
  VMValue *pVVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  bool bVar6;
  double dVar7;
  int local_fc;
  bool local_bb;
  TAngle<double> local_b8;
  FName local_ac;
  int local_a8;
  TFlags<ActorFlag7,_unsigned_int> local_a4;
  int newdam;
  TFlags<ActorFlag5,_unsigned_int> local_9c;
  FName local_98;
  uint local_94;
  FName dmgType;
  int dmgFlags;
  AActor *local_78;
  AActor *flash;
  double actualDistance;
  int actualDamage;
  int damageSteps;
  int i;
  MetaClass *flashtype;
  double dStack_48;
  int flags;
  double distance;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x558,
                  "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar6) {
    this = (AActor *)(param->field_0).field_1.a;
    local_bb = true;
    if (this != (AActor *)0x0) {
      local_bb = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_bb == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x558,
                    "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar3->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x559,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      distance._4_4_ = (pVVar3->field_0).i;
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x559,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      distance._4_4_ = param[1].field_0.i;
    }
    if (numparam < 3) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar3->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55a,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      dStack_48 = (pVVar3->field_0).f;
    }
    else {
      if (param[2].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55a,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      dStack_48 = param[2].field_0.f;
    }
    if (numparam < 4) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar3->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55b,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      flashtype._4_4_ = (pVVar3->field_0).i;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55b,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      flashtype._4_4_ = param[3].field_0.i;
    }
    if (numparam < 5) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      bVar6 = false;
      if ((pVVar3->field_0).field_3.Type == '\x03') {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        bVar6 = true;
        if ((pVVar3->field_0).field_1.atag != 1) {
          pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
          bVar6 = (pVVar3->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar6) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55c,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      _damageSteps = (PClassActor *)(pVVar3->field_0).field_1.a;
    }
    else {
      bVar6 = false;
      if ((param[4].field_0.field_3.Type == '\x03') &&
         (bVar6 = true, param[4].field_0.field_1.atag != 1)) {
        bVar6 = param[4].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar6) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x55c,
                      "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _damageSteps = (PClassActor *)param[4].field_0.field_1.a;
    }
    pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
    dVar7 = AActor::Distance3D(this,pAVar4,false);
    if (dVar7 < dStack_48) {
      iVar1 = distance._4_4_ - (int)(((double)distance._4_4_ * dVar7) / dStack_48);
      actualDistance._4_4_ = iVar1;
      if ((flashtype._4_4_ & 1) != 0) {
        actualDistance._4_4_ = 0;
        for (actualDamage = 0; actualDamage < iVar1; actualDamage = actualDamage + 1) {
          uVar2 = FRandom::operator()(&pr_bfgselfdamage);
          actualDistance._4_4_ = (uVar2 & 7) + 1 + actualDistance._4_4_;
        }
      }
      local_78 = (AActor *)0x0;
      if (_damageSteps != (PClassActor *)0x0) {
        pAVar4 = TObjPtr<AActor>::operator->(&this->target);
        pAVar5 = TObjPtr<AActor>::operator->(&this->target);
        AActor::PosPlusZ((DVector3 *)&dmgType,pAVar4,pAVar5->Height / 4.0);
        local_78 = Spawn(_damageSteps,(DVector3 *)&dmgType,ALLOW_REPLACE);
      }
      local_94 = 0;
      FName::FName(&local_98,NAME_BFGSplash);
      if (local_78 != (AActor *)0x0) {
        iVar1 = (int)local_78;
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_9c,
                   iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                           MF5_NODROPOFF));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_9c);
        if (uVar2 != 0) {
          (local_78->target).field_0 = (this->target).field_0;
        }
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  ((TFlags<ActorFlag3,_unsigned_int> *)&newdam,
                   iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&newdam);
        if (uVar2 != 0) {
          local_94 = local_94 | 0x40;
        }
        TFlags<ActorFlag7,_unsigned_int>::operator&
                  (&local_a4,
                   iVar1 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|
                           MF7_ALWAYSTELEFRAG));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
        if (uVar2 != 0) {
          local_94 = local_94 | 0x80;
        }
        FName::operator=(&local_98,&(local_78->DamageType).super_FName);
      }
      pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      FName::FName(&local_ac,&local_98);
      uVar2 = local_94;
      TAngle<double>::TAngle(&local_b8,0.0);
      local_a8 = P_DamageMobj(pAVar4,this,pAVar5,actualDistance._4_4_,&local_ac,uVar2,&local_b8);
      local_fc = local_a8;
      if (local_a8 < 1) {
        local_fc = actualDistance._4_4_;
      }
      pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      P_TraceBleed(local_fc,pAVar4,this);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x558,
                "int AF_AActor_A_RadiusDamageSelf(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusDamageSelf)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(damage);
	PARAM_FLOAT_DEF(distance);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(flashtype, AActor);

	int 				i;
	int 				damageSteps;
	int 				actualDamage;
	double 				actualDistance;

	actualDistance = self->Distance3D(self->target);
	if (actualDistance < distance)
	{
		// [XA] Decrease damage with distance. Use the BFG damage
		//      calculation formula if the flag is set (essentially
		//      a generalization of SMMU's BFG11K behavior, used
		//      with fraggle's blessing.)
		damageSteps = damage - int(damage * actualDistance / distance);
		if (flags & RDSF_BFGDAMAGE)
		{
			actualDamage = 0;
			for (i = 0; i < damageSteps; ++i)
				actualDamage += (pr_bfgselfdamage() & 7) + 1;
		}
		else
		{
			actualDamage = damageSteps;
		}

		// optional "flash" effect -- spawn an actor on
		// the player to indicate bad things happened.
		AActor *flash = NULL;
		if(flashtype != NULL)
			flash = Spawn(flashtype, self->target->PosPlusZ(self->target->Height / 4), ALLOW_REPLACE);

		int dmgFlags = 0;
		FName dmgType = NAME_BFGSplash;

		if (flash != NULL)
		{
			if (flash->flags5 & MF5_PUFFGETSOWNER) flash->target = self->target;
			if (flash->flags3 & MF3_FOILINVUL) dmgFlags |= DMG_FOILINVUL;
			if (flash->flags7 & MF7_FOILBUDDHA) dmgFlags |= DMG_FOILBUDDHA;
			dmgType = flash->DamageType;
		}

		int newdam = P_DamageMobj(self->target, self, self->target, actualDamage, dmgType, dmgFlags);
		P_TraceBleed(newdam > 0 ? newdam : actualDamage, self->target, self);
	}

	return 0;
}